

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

void sexp_init_context_globals(sexp ctx)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  long lVar4;
  sexp_sint_t in_RDX;
  sexp_sint_t n;
  sexp_sint_t extraout_RDX;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX_00;
  sexp_sint_t extraout_RDX_01;
  sexp_sint_t n_01;
  double *pdVar5;
  anon_union_24768_35_b8e82fc1_for_value *paVar6;
  char **ppcVar7;
  long lVar8;
  byte bVar9;
  sexp feature;
  sexp_gc_var_t local_40;
  
  bVar9 = 0;
  feature = (sexp)&DAT_0000043e;
  psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,in_RDX,(sexp)&DAT_0000006b,(sexp)&DAT_0000043e);
  (ctx->value).type.setters = psVar1;
  psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,n,(sexp)&DAT_0000030b,(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.cpl = psVar1;
  (((ctx->value).type.setters)->value).context.mark_stack[6].start = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[6].end = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[6].prev = (sexp_mark_stack_ptr_t *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[8].start = (sexp_conflict *)0x23e;
  (((ctx->value).type.setters)->value).context.mark_stack[7].start = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[7].end = (sexp_conflict *)0x3e;
  (((ctx->value).type.setters)->value).context.mark_stack[7].prev = (sexp_mark_stack_ptr_t *)0x1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"out of memory",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.print = psVar1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"out of stack space",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.dl = psVar1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"incompatible ABI",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).type.finalize_name = psVar1;
  psVar1 = sexp_user_exception(ctx,(sexp)&DAT_0000003e,"interrupt",(sexp)&DAT_0000023e);
  (((ctx->value).type.setters)->value).opcode.methods = psVar1;
  psVar1 = sexp_intern(ctx,"quote",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[0].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"quasiquote",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[0].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"unquote",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[0].prev = (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(ctx,"unquote-splicing",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[1].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"syntax",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[1].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"quasisyntax",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[1].prev = (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(ctx,"unsyntax",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[2].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"unsyntax-splicing",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[2].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"current-input-port",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[3].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"current-output-port",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[3].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"current-error-port",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[3].prev = (sexp_mark_stack_ptr_t *)psVar1;
  psVar1 = sexp_intern(ctx,"interaction-environment",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[4].start = (sexp_conflict *)psVar1;
  psVar1 = sexp_intern(ctx,"continuable",-1);
  (((ctx->value).type.setters)->value).context.mark_stack[4].end = (sexp_conflict *)psVar1;
  psVar1 = sexp_alloc_tagged_aux(ctx,0x10,10);
  (((ctx->value).type.setters)->value).context.mark_stack[2].prev = (sexp_mark_stack_ptr_t *)psVar1;
  ((((ctx->value).type.setters)->value).context.mark_stack[2].prev)->end = (sexp_conflict *)0x0;
  (((ctx->value).type.setters)->value).bytecode.max_depth = 0x23e;
  sexp_push_op(ctx,&(((ctx->value).type.setters)->value).type.setters,(sexp)&DAT_0000003e);
  psVar1 = sexp_intern(ctx,"little-endian",-1);
  (((((ctx->value).type.setters)->value).type.setters)->value).type.name = psVar1;
  psVar1 = sexp_intern(ctx,"little",-1);
  (((ctx->value).type.setters)->value).type.slots = psVar1;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  n_01 = extraout_RDX;
  local_40.var = &feature;
  for (ppcVar7 = sexp_initial_features; psVar1 = (sexp)*ppcVar7, psVar1 != (sexp)0x0;
      ppcVar7 = ppcVar7 + 1) {
    psVar3 = ctx;
    feature = sexp_intern(ctx,(char *)psVar1,-1);
    psVar2 = (ctx->value).type.setters;
    psVar1 = sexp_memq_op(psVar3,psVar1,n_00,feature,(psVar2->value).type.setters);
    n_01 = extraout_RDX_00;
    if (psVar1 == (sexp)&DAT_0000003e) {
      sexp_push_op(ctx,&(psVar2->value).type.setters,(sexp)&DAT_0000003e);
      (((((ctx->value).type.setters)->value).type.setters)->value).type.name = feature;
      n_01 = extraout_RDX_01;
    }
  }
  (ctx->value).context.saves = local_40.next;
  (((ctx->value).type.setters)->value).type.id = (sexp)0x53;
  lVar8 = 0;
  psVar1 = sexp_make_vector_op(ctx,(sexp)0x0,n_01,(sexp)&DAT_000000a5,(sexp)&DAT_0000043e);
  (((ctx->value).type.setters)->value).type.getters = psVar1;
  ppcVar7 = &((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
  psVar1 = (sexp)0x0;
  while( true ) {
    if (lVar8 == 0x11f0) {
      return;
    }
    psVar2 = sexp_alloc_tagged_aux(ctx,0x78,1);
    if (psVar2 == (sexp)0x0) break;
    pdVar5 = (double *)((long)&_sexp_type_specs[0].name + lVar8);
    paVar6 = &psVar2->value;
    for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
      paVar6->flonum = *pdVar5;
      pdVar5 = pdVar5 + (ulong)bVar9 * -2 + 1;
      paVar6 = (anon_union_24768_35_b8e82fc1_for_value *)((long)paVar6 + (ulong)bVar9 * -0x10 + 8);
    }
    *ppcVar7 = (char *)psVar2;
    psVar3 = sexp_c_string(ctx,(char *)(psVar2->value).type.name,-1);
    (psVar2->value).type.name = psVar3;
    psVar3 = (psVar2->value).type.finalize_name;
    if (psVar3 != (sexp)0x0) {
      psVar3 = sexp_c_string(ctx,(char *)psVar3,-1);
      (psVar2->value).type.finalize_name = psVar3;
    }
    psVar3 = (psVar2->value).type.print;
    if (psVar3 != (sexp)0x0) {
      if ((psVar1 == (sexp)0x0) || (psVar3 != (sexp)(psVar1->value).opcode.func)) {
        psVar1 = sexp_make_foreign(ctx,"sexp_write_simple_object",3,0,(char *)0x0,(sexp_proc1)psVar3
                                   ,(sexp)0x0);
      }
      (psVar2->value).type.print = psVar1;
    }
    lVar8 = lVar8 + 0x70;
    ppcVar7 = ppcVar7 + 1;
  }
  return;
}

Assistant:

void sexp_init_context_globals (sexp ctx) {
  const char** features;
  int i, endianess_check = 1;
  sexp type, *vec, print=NULL;
  sexp_gc_var1(feature);
  sexp_context_globals(ctx)
    = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_G_NUM_GLOBALS), SEXP_VOID);
#if ! SEXP_USE_GLOBAL_SYMBOLS
  sexp_global(ctx, SEXP_G_SYMBOLS) = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_SYMBOL_TABLE_SIZE), SEXP_NULL);
#endif
  sexp_global(ctx, SEXP_G_STRICT_P) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_NO_TAIL_CALLS_P) = SEXP_FALSE;
#if SEXP_USE_FOLD_CASE_SYMS
  sexp_global(ctx, SEXP_G_FOLD_CASE_P) = sexp_make_boolean(SEXP_DEFAULT_FOLD_CASE_SYMS);
#endif
#if ! SEXP_USE_BOEHM
  sexp_global(ctx, SEXP_G_PRESERVATIVES) = SEXP_NULL;
#endif
#if SEXP_USE_WEAK_REFERENCES
  sexp_global(ctx, SEXP_G_WEAK_OBJECTS_PRESENT) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_FILE_DESCRIPTORS) = SEXP_FALSE;
  sexp_global(ctx, SEXP_G_NUM_FILE_DESCRIPTORS) = SEXP_ZERO;
#endif
  sexp_global(ctx, SEXP_G_OOM_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "out of memory", SEXP_NULL);
  sexp_global(ctx, SEXP_G_OOS_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "out of stack space", SEXP_NULL);
  sexp_global(ctx, SEXP_G_ABI_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "incompatible ABI", SEXP_NULL);
  sexp_global(ctx, SEXP_G_INTERRUPT_ERROR) = sexp_user_exception(ctx, SEXP_FALSE, "interrupt", SEXP_NULL);
  sexp_global(ctx, SEXP_G_QUOTE_SYMBOL) = sexp_intern(ctx, "quote", -1);
  sexp_global(ctx, SEXP_G_QUASIQUOTE_SYMBOL) = sexp_intern(ctx, "quasiquote", -1);
  sexp_global(ctx, SEXP_G_UNQUOTE_SYMBOL) = sexp_intern(ctx, "unquote", -1);
  sexp_global(ctx, SEXP_G_UNQUOTE_SPLICING_SYMBOL) = sexp_intern(ctx, "unquote-splicing", -1);
  sexp_global(ctx, SEXP_G_SYNTAX_SYMBOL) = sexp_intern(ctx, "syntax", -1);
  sexp_global(ctx, SEXP_G_QUASISYNTAX_SYMBOL) = sexp_intern(ctx, "quasisyntax", -1);
  sexp_global(ctx, SEXP_G_UNSYNTAX_SYMBOL) = sexp_intern(ctx, "unsyntax", -1);
  sexp_global(ctx, SEXP_G_UNSYNTAX_SPLICING_SYMBOL) = sexp_intern(ctx, "unsyntax-splicing", -1);
  sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL) = sexp_intern(ctx, "current-input-port", -1);
  sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL) = sexp_intern(ctx, "current-output-port", -1);
  sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL) = sexp_intern(ctx, "current-error-port", -1);
  sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL) = sexp_intern(ctx, "interaction-environment", -1);
  sexp_global(ctx, SEXP_G_CONTINUABLE_SYMBOL) = sexp_intern(ctx, "continuable", -1);
  sexp_global(ctx, SEXP_G_EMPTY_VECTOR) = sexp_alloc_type(ctx, vector, SEXP_VECTOR);
  sexp_vector_length(sexp_global(ctx, SEXP_G_EMPTY_VECTOR)) = 0;
  sexp_global(ctx, SEXP_G_FEATURES) = SEXP_NULL;
  sexp_push(ctx, sexp_global(ctx, SEXP_G_FEATURES), SEXP_FALSE);
  sexp_car(sexp_global(ctx, SEXP_G_FEATURES)) = sexp_intern(ctx, (*(unsigned char*) &endianess_check) ? "little-endian" : "big-endian", -1);
  sexp_global(ctx, SEXP_G_ENDIANNESS) = sexp_intern(ctx, (*(unsigned char*) &endianess_check) ? "little" : "big", -1);
  sexp_gc_preserve1(ctx, feature);
  for (features=sexp_initial_features; *features; features++) {
    feature = sexp_intern(ctx, *features, -1);
    if (sexp_not(sexp_memq(ctx, feature, sexp_global(ctx, SEXP_G_FEATURES)))) {
      sexp_push(ctx, sexp_global(ctx, SEXP_G_FEATURES), SEXP_FALSE);
      sexp_car(sexp_global(ctx, SEXP_G_FEATURES)) = feature;
    }
  }
  sexp_gc_release1(ctx);
  sexp_global(ctx, SEXP_G_NUM_TYPES) = sexp_make_fixnum(SEXP_NUM_CORE_TYPES);
  sexp_global(ctx, SEXP_G_TYPES)
    = sexp_make_vector(ctx, sexp_make_fixnum(SEXP_INIT_NUM_TYPES), SEXP_VOID);
  vec = sexp_vector_data(sexp_global(ctx, SEXP_G_TYPES));
  for (i=0; i<SEXP_NUM_CORE_TYPES; i++) {
    type = sexp_alloc_type(ctx, type, SEXP_TYPE);
    if (!type) {
      return; /* TODO - fundamental OOM, what to do here? */
    }
    memcpy(&(type->value), &(_sexp_type_specs[i]), sizeof(_sexp_type_specs[0]));
    vec[i] = type;
    sexp_type_name(type) = sexp_c_string(ctx, (char*)sexp_type_name(type), -1);
    if (sexp_type_finalize_name(type)) {
      sexp_type_finalize_name(type) = sexp_c_string(ctx, (char*)sexp_type_finalize_name(type), -1);
    }
    if (sexp_type_print(type)) {
      if (print && ((sexp_proc1)sexp_type_print(type) == sexp_opcode_func(print)))
        sexp_type_print(type) = print;
      else
        sexp_type_print(type) = print = sexp_make_foreign(ctx, "sexp_write_simple_object", 3, 0, NULL, (sexp_proc1)sexp_type_print(type), NULL);
    }
  }
}